

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O3

bool __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::operator==
          (_ItemSimilarityRecommenderData *this,_ItemSimilarityRecommenderData *other)

{
  size_t sVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  
  if ((((this->num_items == other->num_items) &&
       ((this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (other->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
      (bVar2 = std::__equal<false>::
               equal<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
                         ((this->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left,(_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                   )&(this->item_interactions)._M_t._M_impl.super__Rb_tree_header,
                          (other->item_interactions)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left), bVar2)) &&
     ((((this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (other->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_node_count &&
       (bVar2 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,double>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,double>>>
                          ((this->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left,(_Rb_tree_const_iterator<std::pair<const_unsigned_long,_double>_>
                                   )&(this->item_shift_values)._M_t._M_impl.super__Rb_tree_header,
                           (other->item_shift_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left), bVar2)) &&
      (sVar1 = (this->item_restriction_input_column)._M_string_length,
      sVar1 == (other->item_restriction_input_column)._M_string_length)))) {
    if ((sVar1 != 0) &&
       (iVar4 = bcmp((this->item_restriction_input_column)._M_dataplus._M_p,
                     (other->item_restriction_input_column)._M_dataplus._M_p,sVar1), iVar4 != 0)) {
      return false;
    }
    sVar1 = (this->num_recommendations_input_column)._M_string_length;
    if (sVar1 == (other->num_recommendations_input_column)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar4 = bcmp((this->num_recommendations_input_column)._M_dataplus._M_p,
                       (other->num_recommendations_input_column)._M_dataplus._M_p,sVar1), iVar4 != 0
         )) {
        return false;
      }
      sVar1 = (this->item_exclusion_input_column)._M_string_length;
      if (sVar1 == (other->item_exclusion_input_column)._M_string_length) {
        if ((sVar1 != 0) &&
           (iVar4 = bcmp((this->item_exclusion_input_column)._M_dataplus._M_p,
                         (other->item_exclusion_input_column)._M_dataplus._M_p,sVar1), iVar4 != 0))
        {
          return false;
        }
        _Var3 = std::operator==(&this->item_data_input_column,&other->item_data_input_column);
        if ((((_Var3) &&
             (_Var3 = std::operator==(&this->item_list_output_column,&other->item_list_output_column
                                     ), _Var3)) &&
            (_Var3 = std::operator==(&this->item_score_output_column,
                                     &other->item_score_output_column), _Var3)) &&
           (bVar2 = std::operator==(&this->string_id_values,&other->string_id_values), bVar2)) {
          bVar2 = std::operator==(&this->integer_id_values,&other->integer_id_values);
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool _ItemSimilarityRecommenderData::operator==(const _ItemSimilarityRecommenderData& other) const {
    return (num_items == other.num_items
            && item_interactions == other.item_interactions
            && item_shift_values == other.item_shift_values
            && item_restriction_input_column == other.item_restriction_input_column
            && num_recommendations_input_column == other.num_recommendations_input_column
            && item_exclusion_input_column == other.item_exclusion_input_column
            && item_data_input_column == other.item_data_input_column
            && item_list_output_column == other.item_list_output_column
            && item_score_output_column == other.item_score_output_column
            && string_id_values == other.string_id_values
            && integer_id_values == other.integer_id_values);

  }